

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

RepRef __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::CountLinearReps
          (CordRepAnalyzer *this,RepRef rep,MemoryUsage *memory_usage)

{
  CordRepKind CVar1;
  CordRepSubstring *pCVar2;
  CordRepFlat *this_00;
  size_t size_00;
  RepRef RVar3;
  size_t size_1;
  size_t size;
  CordRep *local_40;
  MemoryUsage *memory_usage_local;
  CordRepAnalyzer *this_local;
  RepRef rep_local;
  CordRep *local_10;
  
  rep_local.rep = (CordRep *)rep.refcount;
  this_local = (CordRepAnalyzer *)rep.rep;
  while( true ) {
    CVar1 = RepRef::tag((RepRef *)&this_local);
    if (CVar1 != SUBSTRING) break;
    this->statistics_->node_count = this->statistics_->node_count + 1;
    (this->statistics_->node_counts).substring = (this->statistics_->node_counts).substring + 1;
    MemoryUsage::Add(memory_usage,0x20,(size_t)rep_local.rep);
    pCVar2 = CordRep::substring((CordRep *)this_local);
    RVar3 = RepRef::Child((RepRef *)&this_local,pCVar2->child);
    size = (size_t)RVar3.rep;
    this_local = (CordRepAnalyzer *)size;
    local_40 = (CordRep *)RVar3.refcount;
    rep_local.rep = local_40;
  }
  CVar1 = RepRef::tag((RepRef *)&this_local);
  if ((int)CVar1 < 6) {
    CVar1 = RepRef::tag((RepRef *)&this_local);
    if (CVar1 == EXTERNAL) {
      this->statistics_->node_count = this->statistics_->node_count + 1;
      (this->statistics_->node_counts).external = (this->statistics_->node_counts).external + 1;
      MemoryUsage::Add(memory_usage,(size_t)&(this_local->statistics_->node_counts).flat_64,
                       (size_t)rep_local.rep);
      rep_local.refcount = 0;
      local_10 = (CordRep *)0x0;
    }
    else {
      rep_local.refcount = (size_t)this_local;
      local_10 = rep_local.rep;
    }
  }
  else {
    this_00 = CordRep::flat((CordRep *)this_local);
    size_00 = CordRepFlat::AllocatedSize(this_00);
    CountFlat(this,size_00);
    MemoryUsage::Add(memory_usage,size_00,(size_t)rep_local.rep);
    rep_local.refcount = 0;
    local_10 = (CordRep *)0x0;
  }
  RVar3.refcount = (size_t)local_10;
  RVar3.rep = (CordRep *)rep_local.refcount;
  return RVar3;
}

Assistant:

RepRef CountLinearReps(RepRef rep, MemoryUsage& memory_usage) {
    // Consume all substrings
    while (rep.tag() == SUBSTRING) {
      statistics_.node_count++;
      statistics_.node_counts.substring++;
      memory_usage.Add(sizeof(CordRepSubstring), rep.refcount);
      rep = rep.Child(rep.rep->substring()->child);
    }

    // Consume possible FLAT
    if (rep.tag() >= FLAT) {
      size_t size = rep.rep->flat()->AllocatedSize();
      CountFlat(size);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    // Consume possible external
    if (rep.tag() == EXTERNAL) {
      statistics_.node_count++;
      statistics_.node_counts.external++;
      size_t size = rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    return rep;
  }